

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

void __thiscall
capnp::QueuedClient::QueuedClient
          (QueuedClient *this,Promise<kj::Own<capnp::ClientHook>_> *promiseParam)

{
  Own<kj::_::PromiseNode> OStack_58;
  Own<kj::_::PromiseNode> local_48;
  QueuedClient *local_38;
  anon_class_8_1_8991fb9c_for_errorHandler local_30;
  
  ClientHook::ClientHook(&this->super_ClientHook);
  (this->super_Refcounted).refcount = 0;
  (this->super_ClientHook)._vptr_ClientHook = (_func_int **)&PTR_newCall_003a06b0;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&PTR_disposeImpl_003a0708;
  (this->redirect).ptr.disposer = (Disposer *)0x0;
  (this->redirect).ptr.ptr = (ClientHook *)0x0;
  kj::Promise<kj::Own<capnp::ClientHook>_>::fork
            ((Promise<kj::Own<capnp::ClientHook>_> *)&this->promise);
  kj::ForkedPromise<kj::Own<capnp::ClientHook>_>::addBranch
            ((ForkedPromise<kj::Own<capnp::ClientHook>_> *)&local_48);
  local_38 = this;
  local_30.this = this;
  kj::Promise<kj::Own<capnp::ClientHook>>::
  then<capnp::QueuedClient::QueuedClient(kj::Promise<kj::Own<capnp::ClientHook>>&&)::_lambda(kj::Own<capnp::ClientHook>&&)_1_,capnp::QueuedClient::QueuedClient(kj::Promise<kj::Own<capnp::ClientHook>>&&)::_lambda(kj::Exception&&)_1_>
            ((Promise<kj::Own<capnp::ClientHook>> *)&OStack_58,
             (anon_class_8_1_8991fb9c_for_func *)&local_48,&local_30);
  kj::Promise<void>::eagerlyEvaluate(&this->selfResolutionOp,&OStack_58);
  kj::Own<kj::_::PromiseNode>::dispose(&OStack_58);
  kj::Own<kj::_::PromiseNode>::dispose(&local_48);
  kj::ForkedPromise<kj::Own<capnp::ClientHook>_>::addBranch
            ((ForkedPromise<kj::Own<capnp::ClientHook>_> *)&OStack_58);
  kj::Promise<kj::Own<capnp::ClientHook>_>::fork
            ((Promise<kj::Own<capnp::ClientHook>_> *)&this->promiseForCallForwarding);
  kj::Own<kj::_::PromiseNode>::dispose(&OStack_58);
  kj::ForkedPromise<kj::Own<capnp::ClientHook>_>::addBranch
            ((ForkedPromise<kj::Own<capnp::ClientHook>_> *)&OStack_58);
  kj::Promise<kj::Own<capnp::ClientHook>_>::fork
            ((Promise<kj::Own<capnp::ClientHook>_> *)&this->promiseForClientResolution);
  kj::Own<kj::_::PromiseNode>::dispose(&OStack_58);
  return;
}

Assistant:

QueuedClient(kj::Promise<kj::Own<ClientHook>>&& promiseParam)
      : promise(promiseParam.fork()),
        selfResolutionOp(promise.addBranch().then([this](kj::Own<ClientHook>&& inner) {
          redirect = kj::mv(inner);
        }, [this](kj::Exception&& exception) {
          redirect = newBrokenCap(kj::mv(exception));
        }).eagerlyEvaluate(nullptr)),
        promiseForCallForwarding(promise.addBranch().fork()),
        promiseForClientResolution(promise.addBranch().fork()) {}